

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::initFromPath
          (BinaryRegistryWriter *this,string *srcPath)

{
  bool bVar1;
  char cVar2;
  size_type __n;
  ProgramBinary *this_00;
  Exception *pEVar3;
  long lVar4;
  uint uVar5;
  allocator_type local_306;
  allocator<char> local_305;
  deUint32 local_304;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  UniquePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> binary;
  deUint32 index;
  undefined4 uStack_2c4;
  string baseName;
  FilePath path;
  DirectoryIterator iter;
  stringstream str;
  long local_228 [2];
  int aiStack_218 [122];
  
  std::__cxx11::string::string((string *)&str,(string *)srcPath);
  de::DirectoryIterator::DirectoryIterator(&iter,(FilePath *)&str);
  std::__cxx11::string::~string((string *)&str);
  do {
    bVar1 = de::DirectoryIterator::hasItem(&iter);
    if (!bVar1) {
      de::DirectoryIterator::~DirectoryIterator(&iter);
      return;
    }
    de::DirectoryIterator::getItem(&path,&iter);
    de::FilePath::getBaseName_abi_cxx11_(&baseName,&path);
    if (((((baseName._M_string_length == 0xe) && (*baseName._M_dataplus._M_p == '0')) &&
         (baseName._M_dataplus._M_p[1] == 'x')) &&
        ((baseName._M_dataplus._M_p[10] == '.' && (baseName._M_dataplus._M_p[0xb] == 's')))) &&
       ((baseName._M_dataplus._M_p[0xc] == 'p' && (baseName._M_dataplus._M_p[0xd] == 'v')))) {
      for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
        if ((9 < (byte)(baseName._M_dataplus._M_p[lVar4 + 2] - 0x30U)) &&
           ((uVar5 = (byte)baseName._M_dataplus._M_p[lVar4 + 2] - 0x41, 0x25 < uVar5 ||
            ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) == 0)))) goto LAB_008a5544;
      }
      index = 0xffffffff;
      std::__cxx11::stringstream::stringstream((stringstream *)&str);
      *(uint *)((long)aiStack_218 + *(long *)(local_228[0] + -0x18) + 8) =
           *(uint *)((long)aiStack_218 + *(long *)(local_228[0] + -0x18) + 8) & 0xffffffb5 | 8;
      std::__cxx11::string::substr((ulong)&bytes,(ulong)&baseName);
      std::operator<<((ostream *)local_228,(string *)&bytes);
      std::__cxx11::string::~string((string *)&bytes);
      std::istream::_M_extract<unsigned_int>((uint *)&str);
      local_304 = index;
      std::__cxx11::stringstream::~stringstream((stringstream *)&str);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&index,path.m_path._M_dataplus._M_p,&local_305);
      std::ifstream::ifstream((string *)&str,(char *)CONCAT44(uStack_2c4,index),_S_bin|_S_ate);
      __n = std::istream::tellg();
      cVar2 = std::__basic_file<char>::is_open();
      if ((cVar2 == '\0') || (*(int *)((long)aiStack_218 + *(long *)(_str + -0x18)) != 0)) {
        pEVar3 = (Exception *)__cxa_allocate_exception(0x30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bytes,
                       "Failed to open ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index);
        tcu::Exception::Exception(pEVar3,(string *)&bytes);
        __cxa_throw(pEVar3,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
      }
      if (__n == 0) {
        pEVar3 = (Exception *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bytes,"Malformed binary, size = 0",(allocator<char> *)&local_306);
        tcu::Exception::Exception(pEVar3,(string *)&bytes);
        __cxa_throw(pEVar3,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
      }
      std::istream::seekg((long)&str,_S_beg);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&bytes,__n,&local_306);
      std::istream::read((char *)&str,
                         (long)bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      this_00 = (ProgramBinary *)operator_new(0x20);
      ProgramBinary::ProgramBinary
                (this_00,PROGRAM_FORMAT_SPIRV,
                 (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                 bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::ifstream::~ifstream((string *)&str);
      binary.super_UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>.m_data.ptr
           = this_00;
      std::__cxx11::string::~string((string *)&index);
      addBinary(this,local_304,
                binary.super_UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>.
                m_data.ptr);
      de::details::UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>::
      ~UniqueBase(&binary.
                   super_UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>);
    }
LAB_008a5544:
    std::__cxx11::string::~string((string *)&baseName);
    std::__cxx11::string::~string((string *)&path);
    de::DirectoryIterator::next(&iter);
  } while( true );
}

Assistant:

void BinaryRegistryWriter::initFromPath (const std::string& srcPath)
{
	DE_ASSERT(m_binaries.empty());

	for (de::DirectoryIterator iter(srcPath); iter.hasItem(); iter.next())
	{
		const de::FilePath	path		= iter.getItem();
		const std::string	baseName	= path.getBaseName();

		if (isProgramFileName(baseName))
		{
			const deUint32						index	= getProgramIndexFromName(baseName);
			const de::UniquePtr<ProgramBinary>	binary	(readBinary(path.getPath()));

			addBinary(index, *binary);
			// \note referenceCount is left to 0 and will only be incremented
			//		 if binary is reused (added via addProgram()).
		}
	}
}